

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::atomic_max
               (NegativeTestContext *ctx)

{
  ShaderType SVar1;
  NegativeTestContext *pNVar2;
  bool bVar3;
  char *__s;
  DataType dataDataType;
  undefined1 *in_stack_fffffffffffffe88;
  string local_110;
  undefined1 local_f0 [8];
  string shaderSource_1;
  undefined1 local_b0 [8];
  string shaderSource;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  int local_48;
  int shaderNdx;
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"atomicMax",&local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  for (local_48 = 0; local_48 < 6; local_48 = local_48 + 1) {
    bVar3 = NegativeTestContext::isShaderSupported
                      (local_10,*(ShaderType *)
                                 (NegativeTestShared::(anonymous_namespace)::s_shaders +
                                 (long)local_48 * 4));
    pNVar2 = local_10;
    dataDataType = (DataType)in_stack_fffffffffffffe88;
    if (bVar3) {
      __s = glu::getShaderTypeName
                      (*(ShaderType *)
                        (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4))
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,__s,
                 (allocator<char> *)(shaderSource.field_2._M_local_buf + 0xf));
      std::operator+(&local_68,"Verify shader: ",&local_88);
      NegativeTestContext::beginSection(pNVar2,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator((allocator<char> *)(shaderSource.field_2._M_local_buf + 0xf))
      ;
      NegativeTestShared::(anonymous_namespace)::genShaderSourceAtomicOperations_abi_cxx11_
                ((string *)local_b0,(_anonymous_namespace_ *)local_10,
                 (NegativeTestContext *)
                 (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                 (long)local_48 * 4),0x12,
                 SHADER_FUNCTION_INTERPOLATED_AT_CENTROID|SHADER_FUNCTION_IMUL_EXTENDED,TYPE_INT,
                 dataDataType);
      pNVar2 = local_10;
      SVar1 = *(ShaderType *)
               (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
      std::__cxx11::string::string
                ((string *)(shaderSource_1.field_2._M_local_buf + 8),(string *)local_b0);
      verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_1.field_2 + 8));
      std::__cxx11::string::~string((string *)(shaderSource_1.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_b0);
      in_stack_fffffffffffffe88 = NegativeTestShared::(anonymous_namespace)::s_shaders;
      NegativeTestShared::(anonymous_namespace)::genShaderSourceAtomicOperations_abi_cxx11_
                ((string *)local_f0,(_anonymous_namespace_ *)local_10,
                 (NegativeTestContext *)
                 (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                 (long)local_48 * 4),0x12,SHADER_FUNCTION_LAST,TYPE_UINT,0x2c34be0);
      pNVar2 = local_10;
      SVar1 = *(ShaderType *)(in_stack_fffffffffffffe88 + (long)local_48 * 4);
      std::__cxx11::string::string((string *)&local_110,(string *)local_f0);
      verifyShader(pNVar2,SVar1,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)local_f0);
      NegativeTestContext::endSection(local_10);
    }
  }
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void atomic_max (NegativeTestContext& ctx)
{
	ctx.beginSection("atomicMax");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			{
				const std::string shaderSource(genShaderSourceAtomicOperations(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_ATOMIC_MAX, glu::TYPE_UINT, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceAtomicOperations(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_ATOMIC_MAX, glu::TYPE_INT, glu::TYPE_UINT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}